

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O0

void __thiscall docopt::LeafPattern::setValue(LeafPattern *this,value *v)

{
  value *in_RSI;
  value *in_stack_ffffffffffffffe8;
  
  docopt::value::operator=(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void setValue(value&& v) { fValue = std::move(v); }